

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

string * __thiscall
t_go_generator::function_signature_if
          (string *__return_storage_ptr__,t_go_generator *this,t_function *tfunction,string *prefix,
          bool addError)

{
  t_struct *tstruct;
  t_type *type;
  int iVar1;
  string errs;
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::operator+(&local_68,prefix,&tfunction->name_);
  publicize(&sStack_88,this,&local_68,false);
  std::operator+(__return_storage_ptr__,&sStack_88,"(");
  std::__cxx11::string::~string((string *)&sStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  tstruct = tfunction->arglist_;
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    argument_list_abi_cxx11_(&local_68,this,tstruct);
    std::operator+(&sStack_88,", ",&local_68);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  type = tfunction->returntype_;
  argument_list_abi_cxx11_(&sStack_88,this,tfunction->xceptions_);
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[4])(type);
  if ((char)iVar1 == '\0') {
    type_to_go_type_abi_cxx11_(&local_48,this,type);
    std::operator+(&local_68,"_r ",&local_48);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    if ((!addError) && (sStack_88._M_string_length != 0)) goto LAB_001d0be2;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (addError) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
LAB_001d0be2:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_88);
  return __return_storage_ptr__;
}

Assistant:

string t_go_generator::function_signature_if(t_function* tfunction, string prefix, bool addError) {
  string signature = publicize(prefix + tfunction->get_name()) + "(";
  signature += "ctx context.Context";
  if (!tfunction->get_arglist()->get_members().empty()) {
    signature += ", " + argument_list(tfunction->get_arglist());
  }
  signature += ") (";

  t_type* ret = tfunction->get_returntype();
  t_struct* exceptions = tfunction->get_xceptions();
  string errs = argument_list(exceptions);

  if (!ret->is_void()) {
    signature += "_r " + type_to_go_type(ret);

    if (addError || errs.size() == 0) {
      signature += ", ";
    }
  }

  if (addError) {
    signature += "_err error";
  }

  signature += ")";
  return signature;
}